

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

node_t_conflict left_op(c2m_ctx_t c2m_ctx,int no_err_p,int token,int token2,nonterm_func_t f)

{
  node_code_t nc;
  pos_t p;
  node_t_conflict op1;
  node_t_conflict op;
  token_t ptVar1;
  node *pnVar2;
  
  op1 = (*f)(c2m_ctx,no_err_p);
  pnVar2 = &err_struct;
  if (op1 != &err_struct) {
    ptVar1 = c2m_ctx->parse_ctx->curr_token;
    if ((*(short *)ptVar1 == token) || (pnVar2 = op1, -1 < token2 && *(short *)ptVar1 == token2)) {
      do {
        p = ptVar1->pos;
        nc = ptVar1->node_code;
        read_token((c2m_ctx_t)c2m_ctx->recorded_tokens);
        op1 = new_pos_node1(c2m_ctx,nc,p,op1);
        op = (*f)(c2m_ctx,no_err_p);
        if (op == &err_struct) {
          return &err_struct;
        }
        op_append(c2m_ctx,op1,op);
        ptVar1 = c2m_ctx->parse_ctx->curr_token;
      } while ((*(short *)ptVar1 == token) ||
              (pnVar2 = op1, -1 < token2 && *(short *)ptVar1 == token2));
    }
  }
  return pnVar2;
}

Assistant:

static node_t left_op (c2m_ctx_t c2m_ctx, int no_err_p, int token, int token2, nonterm_func_t f) {
  node_code_t code;
  node_t r, n;
  pos_t pos;

  P (f);
  while (MC (token, pos, code) || (token2 >= 0 && MC (token2, pos, code))) {
    n = new_pos_node1 (c2m_ctx, code, pos, r);
    P (f);
    op_append (c2m_ctx, n, r);
    r = n;
  }
  return r;
}